

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

float resolve_length(render_state_t *state,length_t *length,char mode)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (length->type == length_type_percent) {
    if (mode == 'o') {
      fVar1 = hypotf(state->view_width,state->view_height);
      fVar1 = fVar1 / 1.4142135;
    }
    else if (mode == 'y') {
      fVar1 = state->view_height;
    }
    else if (mode == 'x') {
      fVar1 = state->view_width;
    }
  }
  fVar2 = length->value;
  if (length->type == length_type_percent) {
    fVar2 = (fVar1 * fVar2) / 100.0;
  }
  return fVar2;
}

Assistant:

static float resolve_length(const render_state_t* state, const length_t* length, char mode)
{
    float maximum = 0.f;
    if(length->type == length_type_percent) {
        if(mode == 'x') {
            maximum = state->view_width;
        } else if(mode == 'y') {
            maximum = state->view_height;
        } else if(mode == 'o') {
            maximum = hypotf(state->view_width, state->view_height) / PLUTOVG_SQRT2;
        }
    }

    return convert_length(length, maximum);
}